

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

void __thiscall LowererMDArch::FinalLower(LowererMDArch *this)

{
  OpCode OVar1;
  Lowerer *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int32 iVar5;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  BranchInstr *this_01;
  LabelInstr *targetInstr;
  Opnd *pOVar8;
  Instr *local_40;
  Instr *local_30;
  Instr *instr;
  Instr *instrStop;
  Instr *instrPrev;
  IntConstOpnd *intOpnd;
  LowererMDArch *this_local;
  
  if (this->m_func->m_headInstr == (Instr *)0x0) {
    local_40 = (Instr *)0x0;
  }
  else {
    local_40 = this->m_func->m_headInstr->m_prev;
  }
  local_30 = this->m_func->m_tailInstr;
  do {
    if (local_30 == local_40) {
      return;
    }
    instrStop = local_30->m_prev;
    OVar1 = local_30->m_opcode;
    if (OVar1 == Ret) {
      IR::Instr::Remove(local_30);
    }
    else if (OVar1 == Leave) {
      bVar3 = Func::DoOptimizeTry(this->m_func);
      if ((!bVar3) || (bVar3 = Func::IsLoopBodyInTry(this->m_func), bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0xd27,
                           "(this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry())",
                           "this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = this->lowererMD->m_lowerer;
      this_01 = IR::Instr::AsBranchInstr(local_30);
      targetInstr = IR::BranchInstr::GetTarget(this_01);
      instrStop = Lowerer::LowerLeave(this_00,local_30,targetInstr,true,false);
    }
    else if (OVar1 == LdArgSize) {
      BVar4 = Func::HasTry(this->m_func);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0xd17,"(this->m_func->HasTry())","this->m_func->HasTry()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_30->m_opcode = MOV;
      iVar5 = Func::GetArgsSize(this->m_func);
      pIVar7 = IR::IntConstOpnd::New((long)iVar5,TyUint32,this->m_func,false);
      IR::Instr::SetSrc1(local_30,&pIVar7->super_Opnd);
      LowererMD::Legalize<false>(local_30,false);
    }
    else if (OVar1 == LdSpillSize) {
      BVar4 = Func::HasTry(this->m_func);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0xd1f,"(this->m_func->HasTry())","this->m_func->HasTry()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_30->m_opcode = MOV;
      iVar5 = Func::GetSpillSize(this->m_func);
      pIVar7 = IR::IntConstOpnd::New((long)iVar5,TyUint32,this->m_func,false);
      IR::Instr::SetSrc1(local_30,&pIVar7->super_Opnd);
      LowererMD::Legalize<false>(local_30,false);
    }
    else if ((ushort)(OVar1 - CMOVA) < 0x10) {
      pOVar8 = IR::Instr::GetSrc2(local_30);
      if (pOVar8 != (Opnd *)0x0) {
        IR::Instr::SwapOpnds(local_30);
        IR::Instr::FreeSrc2(local_30);
      }
    }
    else if ((OVar1 == CMPXCHG8B) || (OVar1 == LOCKCMPXCHG8B)) {
      IR::Instr::FreeDst(local_30);
      IR::Instr::FreeSrc2(local_30);
    }
    else {
      bVar3 = IR::Instr::HasLazyBailOut(local_30);
      if (bVar3) {
        Func::SetHasLazyBailOut(this->m_func);
      }
    }
    local_30 = instrStop;
  } while( true );
}

Assistant:

void
LowererMDArch::FinalLower()
{
    IR::IntConstOpnd *intOpnd;

    FOREACH_INSTR_BACKWARD_EDITING_IN_RANGE(instr, instrPrev, this->m_func->m_tailInstr, this->m_func->m_headInstr)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::Ret:
            instr->Remove();
            break;
        case Js::OpCode::LdArgSize:
            Assert(this->m_func->HasTry());
            instr->m_opcode = Js::OpCode::MOV;
            intOpnd = IR::IntConstOpnd::New(this->m_func->GetArgsSize(), TyUint32, this->m_func);
            instr->SetSrc1(intOpnd);
            LowererMD::Legalize(instr);
            break;

        case Js::OpCode::LdSpillSize:
            Assert(this->m_func->HasTry());
            instr->m_opcode = Js::OpCode::MOV;
            intOpnd = IR::IntConstOpnd::New(this->m_func->GetSpillSize(), TyUint32, this->m_func);
            instr->SetSrc1(intOpnd);
            LowererMD::Legalize(instr);
            break;

        case Js::OpCode::Leave:
            Assert(this->m_func->DoOptimizeTry() && !this->m_func->IsLoopBodyInTry());
            instrPrev = this->lowererMD->m_lowerer->LowerLeave(instr, instr->AsBranchInstr()->GetTarget(), true /*fromFinalLower*/);
            break;

        case Js::OpCode::CMOVA:
        case Js::OpCode::CMOVAE:
        case Js::OpCode::CMOVB:
        case Js::OpCode::CMOVBE:
        case Js::OpCode::CMOVE:
        case Js::OpCode::CMOVG:
        case Js::OpCode::CMOVGE:
        case Js::OpCode::CMOVL:
        case Js::OpCode::CMOVLE:
        case Js::OpCode::CMOVNE:
        case Js::OpCode::CMOVNO:
        case Js::OpCode::CMOVNP:
        case Js::OpCode::CMOVNS:
        case Js::OpCode::CMOVO:
        case Js::OpCode::CMOVP:
        case Js::OpCode::CMOVS:
            // Get rid of fake src1.
            if (instr->GetSrc2())
            {
                // CMOV inserted before regalloc have a dummy src1 to simulate the fact that
                // CMOV is not a definite def of the dst.
                instr->SwapOpnds();
                instr->FreeSrc2();
            }
            break;
        case Js::OpCode::LOCKCMPXCHG8B:
        case Js::OpCode::CMPXCHG8B:
            // Get rid of the deps and srcs
            instr->FreeDst();
            instr->FreeSrc2();
            break;
        default:
            if (instr->HasLazyBailOut())
            {
                // Since Lowerer and Peeps might have removed instructions with lazy bailout
                // if we attach them to helper calls, FinalLower is the first phase that
                // we can know if the function has any lazy bailouts at all.
                this->m_func->SetHasLazyBailOut();
            }

            break;
        }
    } NEXT_INSTR_BACKWARD_EDITING_IN_RANGE;
}